

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

ElementPtr __thiscall Rml::Element::Clone(Element *this)

{
  String *instancer_name;
  XMLAttributes *attributes;
  long *plVar1;
  _func_int **pp_Var2;
  NodePtr pDVar3;
  _func_int *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Alloc_hider _Var7;
  PropertyMap *this_00;
  long *in_RSI;
  String inner_rml;
  ElementAttributes clone_attributes;
  String local_58;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_38;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
  plVar1 = (long *)in_RSI[0xf];
  instancer_name = (String *)(in_RSI + 7);
  attributes = (XMLAttributes *)(in_RSI + 0x14);
  if (plVar1 == (long *)0x0) {
    Factory::InstanceElement
              ((Factory *)&local_58,(Element *)0x0,instancer_name,instancer_name,attributes);
    _Var7._M_p = local_58._M_dataplus._M_p;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_58._M_string_length;
    local_58._0_16_ = auVar6 << 0x40;
    ::std::__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
              ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this,
               (pointer)_Var7._M_p);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_58);
  }
  else {
    (**(code **)(*plVar1 + 0x10))((const_iterator *)&local_58,plVar1,0,instancer_name,attributes);
    _Var7._M_p = local_58._M_dataplus._M_p;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_58._M_string_length;
    local_58._0_16_ = auVar5 << 0x40;
    ::std::__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
              ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this,
               (pointer)_Var7._M_p);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_58);
    pp_Var2 = (this->super_ScriptInterface).super_Releasable._vptr_Releasable;
    if (pp_Var2 == (_func_int **)0x0) {
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    if (pp_Var2[0xf] == (_func_int *)0x0) {
      pp_Var2[0xf] = (_func_int *)in_RSI[0xf];
    }
  }
  if ((this->super_ScriptInterface).super_Releasable._vptr_Releasable != (_func_int **)0x0) {
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::vector(&local_38.m_container,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
              *)attributes);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::erase<char[6]>(&local_38,(char (*) [6])0x3264b0);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::erase<char[6]>(&local_38,(char (*) [6])"class");
    SetAttributes((Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable,
                  &local_38);
    this_00 = ElementStyle::GetLocalStyleProperties((ElementStyle *)(in_RSI[0x30] + 0x38));
    local_58._0_16_ =
         robin_hood::detail::
         Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
         ::cbegin(this_00);
    pDVar3 = (NodePtr)this_00->mInfo;
    while ((NodePtr)local_58._M_dataplus._M_p != pDVar3) {
      SetProperty((Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable,
                  (((NodePtr)local_58._M_dataplus._M_p)->mData).first,
                  &(((NodePtr)local_58._M_dataplus._M_p)->mData).second);
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::Iter<true>::operator++((Iter<true> *)&local_58);
    }
    p_Var4 = (this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x30];
    ElementStyle::GetClassNames_abi_cxx11_(&local_58,(ElementStyle *)(in_RSI[0x30] + 0x38));
    ElementStyle::SetClassNames((ElementStyle *)(p_Var4 + 0x38),&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    local_58._M_string_length = 0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58.field_2._M_local_buf[0] = '\0';
    (**(code **)(*in_RSI + 0x40))();
    SetInnerRML((Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable,&local_58
               );
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_38.m_container);
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::Clone() const
{
	ElementPtr clone;

	if (instancer)
	{
		clone = instancer->InstanceElement(nullptr, GetTagName(), attributes);
		if (clone)
			clone->SetInstancer(instancer);
	}
	else
		clone = Factory::InstanceElement(nullptr, GetTagName(), GetTagName(), attributes);

	if (clone)
	{
		// Copy over the attributes. The 'style' and 'class' attributes are skipped because inline styles and class names are copied manually below.
		// This is necessary in case any properties or classes have been set manually, in which case the 'style' and 'class' attributes are out of
		// sync with the used style and active classes.
		ElementAttributes clone_attributes = attributes;
		clone_attributes.erase("style");
		clone_attributes.erase("class");
		clone->SetAttributes(clone_attributes);

		for (auto& id_property : GetStyle()->GetLocalStyleProperties())
			clone->SetProperty(id_property.first, id_property.second);

		clone->GetStyle()->SetClassNames(GetStyle()->GetClassNames());

		String inner_rml;
		GetInnerRML(inner_rml);

		clone->SetInnerRML(inner_rml);
	}

	return clone;
}